

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

void __thiscall ICM::Compiler::IdentifierAnalysis::start(IdentifierAnalysis *this)

{
  Node *node;
  
  if (PrintCompilingProcess == '\x01') {
    println<char[19]>((char (*) [19])"IdentifierAnalysis");
  }
  node = AnalysisBase::GetNode(&this->super_AnalysisBase,1);
  setIdentSub(this,node);
  if (PrintCompilingProcess == '\x01') {
    println<char[4]>((char (*) [4])"-->");
    AnalysisBase::printTable(&this->super_AnalysisBase);
    return;
  }
  return;
}

Assistant:

void start() {
				if (PrintCompilingProcess)
					println("IdentifierAnalysis");

				setIdentSub(GetNode(1));

				if (PrintCompilingProcess) {
					println("-->");
					printTable();
				}
			}